

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O2

int __thiscall
clunk::Node::Search<(clunk::NodeType)1,false>(Node *this,int alpha,int beta,int depth,bool cutNode)

{
  uint32_t uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int beta_00;
  int iVar6;
  uint uVar7;
  HashEntry *this_00;
  Move *pMVar8;
  int iVar9;
  char cVar10;
  uint64_t entryKey;
  Node *pNVar11;
  uint uVar12;
  int iVar13;
  Move firstMove;
  uint local_70;
  uint local_68;
  int local_44;
  
  if (this->parent == (Node *)0x0) {
    __assert_fail("parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6d,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if (this->ply < 1) {
    __assert_fail("ply > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6e,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if (beta <= alpha) {
    __assert_fail("alpha < beta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6f,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  uVar12 = -alpha;
  if (0 < alpha) {
    uVar12 = alpha;
  }
  if (32000 < uVar12) {
    __assert_fail("abs(alpha) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf70,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  uVar12 = -beta;
  if (0 < beta) {
    uVar12 = beta;
  }
  if (32000 < uVar12) {
    __assert_fail("abs(beta) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf71,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if (depth < 1) {
    __assert_fail("depth > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf72,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if (alpha + 1 != beta) {
    __assert_fail("(type == PV) | ((alpha + 1) == beta)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf73,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if ((cutNode) && (bVar3 = Move::IsValid(&this->lastMove), !bVar3)) {
    __assert_fail("cutNode ? lastMove.IsValid() : true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf74,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  _stats._48_8_ = _stats._48_8_ + 1;
  this->moveIndex = 0;
  this->moveCount = 0;
  this->depthChange = 0;
  this->pvCount = 0;
  bVar3 = IsDraw(this);
  iVar4 = _drawScore;
  if (bVar3) {
    this->standPat = _drawScore;
    return iVar4;
  }
  uVar12 = this->ply - 32000;
  if (alpha < (int)uVar12) {
    alpha = uVar12;
  }
  uVar12 = 0x7d01 - this->ply;
  if (beta <= (int)uVar12) {
    uVar12 = beta;
  }
  if (this->child == (Node *)0x0 || (int)uVar12 <= alpha) {
    return alpha;
  }
  if ((this->checks != 0) && (this->parent->depthChange < 1)) {
    _stats._64_8_ = _stats._64_8_ + 1;
    this->depthChange = this->depthChange + 1;
    depth = depth + 1;
  }
  firstMove.bits = 0;
  firstMove.score = 0;
  this_00 = TranspositionTable<clunk::HashEntry>::Get
                      ((TranspositionTable<clunk::HashEntry> *)_tt,this->positionKey);
  if (this_00->key == this->positionKey) {
    _tt._8_8_ = _tt._8_8_ + 1;
    switch(this_00->flags & 7) {
    case 1:
      goto switchD_00132bee_caseD_1;
    case 2:
      goto switchD_00132bee_caseD_2;
    case 3:
      uVar1 = this_00->moveBits;
      iVar4 = HashEntry::Score(this_00,this->ply);
      Move::Init(&firstMove,uVar1,iVar4);
      iVar4 = ValidateMove<false>(this,&firstMove);
      if (iVar4 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf9c,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                     );
      }
      iVar9 = firstMove.score;
      if (firstMove.score <= alpha && (uint)depth <= (uint)this_00->depth) {
        Move::operator=(this->pv,&firstMove);
        this->pvCount = 1;
        return firstMove.score;
      }
      break;
    case 4:
      uVar1 = this_00->moveBits;
      iVar4 = HashEntry::Score(this_00,this->ply);
      Move::Init(&firstMove,uVar1,iVar4);
      iVar4 = ValidateMove<false>(this,&firstMove);
      if (iVar4 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfa8,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                     );
      }
      if ((this_00->flags & 0x10) == 0) {
        __assert_fail("entry->HasPvFlag()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfa9,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                     );
      }
      if ((uint)depth <= (uint)this_00->depth) {
        Move::operator=(this->pv,&firstMove);
        this->pvCount = 1;
        if (firstMove.score < (int)uVar12) {
          if ((alpha < firstMove.score) &&
             ((((ulong)firstMove & 0xff00000) == 0 && this->checks == 0) &&
              (firstMove.bits & 0xf) != 3)) {
            IncHistory(&firstMove,depth);
          }
        }
        else {
          AddKiller(this,&firstMove,depth);
        }
        return firstMove.score;
      }
      iVar9 = firstMove.score;
      break;
    case 5:
      uVar1 = this_00->moveBits;
      iVar4 = HashEntry::Score(this_00,this->ply);
      Move::Init(&firstMove,uVar1,iVar4);
      iVar4 = ValidateMove<false>(this,&firstMove);
      if (iVar4 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfbf,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                     );
      }
      iVar9 = 32000;
      if (((uint)depth <= (uint)this_00->depth) && ((int)uVar12 <= firstMove.score)) {
        Move::operator=(this->pv,&firstMove);
        this->pvCount = 1;
        AddKiller(this,&firstMove,depth);
        return firstMove.score;
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xfca,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                   );
    }
    iVar4 = this->depthChange;
    if (((iVar4 < 1) && (this->parent->depthChange < 1)) && ((this_00->flags & 8) != 0)) {
      _stats._80_8_ = _stats._80_8_ + 1;
      iVar4 = iVar4 + 1;
      this->depthChange = iVar4;
      depth = depth + 1;
    }
  }
  else {
    iVar4 = this->depthChange;
    iVar9 = 32000;
  }
  if (iVar4 < 0) {
    __assert_fail("depthChange >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd5,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if (this->moveIndex != 0) {
    __assert_fail("!moveIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd6,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if (this->moveCount != 0) {
    __assert_fail("!moveCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd7,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if (this->pvCount != 0) {
    __assert_fail("!pvCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd8,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if ((((iVar4 == 0 && this->checks == 0) && cutNode) &&
      (uVar1 = (this->lastMove).bits, uVar1 != this->killer[0].bits)) &&
     ((uVar1 != this->killer[1].bits &&
      ((1 < DAT_00164900 + _pcount && (2 < DAT_00164900 + _pcount + DAT_001648f8)))))) {
    if (alpha + 1U != uVar12) {
      __assert_fail("(alpha + 1) == beta",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xfe0,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                   );
    }
    Evaluate(this);
    if (this->standPat < iVar9) {
      iVar9 = this->standPat;
    }
    if (depth == 1) {
      uVar5 = -uVar12;
      if (0 < (int)uVar12) {
        uVar5 = uVar12;
      }
      if ((uVar5 < 20000) && ((int)(uVar12 + 300) <= iVar9)) {
        _stats._112_8_ = _stats._112_8_ + 1;
        this->depthChange = -1;
        return uVar12;
      }
    }
    else if ((int)uVar12 <= iVar9) {
      ExecNullMove<false>(this,this->child);
      iVar4 = ((depth - (uint)depth / 6) - (uint)((int)uVar12 <= iVar9 + -500)) + -3;
      if (iVar4 < 1) {
        iVar4 = QSearch<true>(this->child,-uVar12,-alpha,0);
      }
      else {
        iVar4 = Search<(clunk::NodeType)1,true>(this->child,-uVar12,-alpha,iVar4,false);
      }
      if (_stop != 0) {
        return uVar12;
      }
      if (uVar12 == -iVar4 || SBORROW4(uVar12,-iVar4) != (int)(uVar12 + iVar4) < 0) {
        _stats._160_8_ = _stats._160_8_ + 1;
        this->depthChange = -depth;
        if (this->standPat <= (int)uVar12) {
          return uVar12;
        }
        return this->standPat;
      }
    }
  }
  if (this->moveIndex != 0) {
    __assert_fail("!moveIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfff,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if (this->moveCount != 0) {
    __assert_fail("!moveCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x1000,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                 );
  }
  if ((uint)depth < 4 || ((ulong)firstMove & 0xf) != 0) {
    if (((ulong)firstMove & 0xf) == 0) {
      if (this->pvCount != 0) {
        __assert_fail("!pvCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1015,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                     );
      }
      GenerateMoves<false,false>(this,depth);
      if (this->moveCount < 1) {
        if (this->checks == 0) {
          HashEntry::SetStalemate(this_00,this->positionKey);
          _tt._24_8_ = _tt._24_8_ + 1;
switchD_00132bee_caseD_2:
          iVar4 = _drawScore;
          this->standPat = _drawScore;
          return iVar4;
        }
        HashEntry::SetCheckmate(this_00,this->positionKey);
        _tt._16_8_ = _tt._16_8_ + 1;
switchD_00132bee_caseD_1:
        return this->ply + -32000;
      }
      pMVar8 = GetNextMove(this);
      Move::operator=(&firstMove,pMVar8);
      if (this->moveIndex != 1) {
        __assert_fail("moveIndex == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1023,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                     );
      }
    }
  }
  else {
    if (this->pvCount != 0) {
      __assert_fail("!pvCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x1005,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                   );
    }
    _stats._144_8_ = _stats._144_8_ + 1;
    iVar4 = Search<(clunk::NodeType)1,false>(this,uVar12 - 1,uVar12,depth - 2,false);
    if (this->pvCount == 0 || _stop != 0) {
      return iVar4;
    }
    if (this->moveCount < 1) {
      __assert_fail("moveCount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x100b,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                   );
    }
    if (this->pvCount < 1) {
      __assert_fail("pvCount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x100c,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                   );
    }
    bVar3 = Move::IsValid(this->pv);
    if (!bVar3) {
      __assert_fail("pv[0].IsValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x100d,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                   );
    }
    Move::operator=(&firstMove,this->pv);
    this->moveIndex = 1;
  }
  if (((this->moveCount == 1) && (this->depthChange < 1)) && (this->parent->depthChange < 1)) {
    _stats._72_8_ = _stats._72_8_ + 1;
    this->depthChange = this->depthChange + 1;
    depth = depth + 1;
  }
  Exec<false>(this,&firstMove,this->child);
  iVar4 = -uVar12;
  if ((uint)depth < 2) {
    uVar5 = QSearch<true>(this->child,iVar4,-alpha,0);
  }
  else {
    uVar5 = Search<(clunk::NodeType)1,true>(this->child,iVar4,-alpha,depth - 1,!cutNode);
  }
  Undo<false>(this,&firstMove);
  local_68 = uVar12;
  if (_stop == 0) {
    local_68 = -uVar5;
    uVar7 = this->child->depthChange;
    local_70 = ((int)uVar7 >> 0x1f & uVar7) + depth;
    UpdatePV(this,&firstMove);
    if (uVar12 != local_68 && SBORROW4(uVar12,local_68) == (int)(uVar12 + uVar5) < 0) {
      if (alpha < (int)local_68) {
        uVar5 = local_68;
        if ((int)uVar7 < 0) {
          __assert_fail("pvDepth == depth",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x1044,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                       );
        }
      }
      else {
        uVar5 = alpha;
        if (((firstMove.bits & 0xf) != 3 && ((ulong)firstMove & 0xff00000) == 0) &&
            this->checks == 0) {
          cVar10 = -1;
          if (-1 < (char)_hist[firstMove.bits & 0xfff]) {
            cVar10 = _hist[firstMove.bits & 0xfff];
          }
          _hist[firstMove.bits & 0xfff] = cVar10 + -1;
        }
      }
      if (this->moveCount < 1) {
        GenerateMoves<false,false>(this,depth);
        if (this->moveCount < 1) {
          __assert_fail("moveCount > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x104e,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                       );
        }
        if ((this->moveCount == 1) && (this->moves[0].bits != firstMove.bits)) {
          __assert_fail("(moveCount == 1) ? (moves[0] == firstMove) : true",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x104f,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                       );
        }
      }
      if (1 < this->moveIndex) {
        __assert_fail("moveIndex <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1052,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                     );
      }
      iVar13 = this->checks;
      iVar9 = depth - 1;
      do {
        beta_00 = -uVar5;
LAB_0013327b:
        do {
          pMVar8 = GetNextMove(this);
          if (pMVar8 == (Move *)0x0) {
            if (this->moveCount < 1) {
              __assert_fail("moveCount > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a3,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                           );
            }
            if ((int)uVar5 < (int)local_68) {
              __assert_fail("best <= alpha",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a4,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                           );
            }
            if ((int)uVar12 <= (int)uVar5) {
              __assert_fail("alpha < beta",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a5,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                           );
            }
            if (this->pvCount < 1) {
              return local_68;
            }
            if ((int)local_70 < 0) {
              __assert_fail("pvDepth >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a8,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                           );
            }
            pMVar8 = this->pv;
            bVar3 = Move::IsValid(pMVar8);
            if (!bVar3) {
              __assert_fail("pv[0].IsValid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a9,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                           );
            }
            uVar12 = this->pv[0].bits;
            if (((uVar12 & 0xf) != 3 && (uVar12 & 0xff00000) == 0) && this->checks == 0) {
              IncHistory(pMVar8,depth);
            }
            if (alpha < (int)local_68) {
              __assert_fail("pvNode",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10ae,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                           );
            }
            if (uVar5 != alpha) {
              __assert_fail("alpha == orig_alpha",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10b6,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                           );
            }
            entryKey = this->positionKey;
            iVar9 = this->ply;
            iVar4 = this->depthChange;
            iVar13 = 3;
            goto LAB_00133598;
          }
          bVar3 = Move::IsValid(pMVar8);
          if (!bVar3) {
            __assert_fail("move->IsValid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x1059,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                         );
          }
        } while (firstMove.bits == pMVar8->bits);
        _stats._192_8_ = _stats._192_8_ + 1;
        Exec<false>(this,pMVar8,this->child);
        pNVar11 = this->child;
        local_44 = iVar9;
        if (iVar13 == 0 && 2 < (uint)depth) {
          _stats._200_8_ = _stats._200_8_ + 1;
          uVar7 = pMVar8->bits;
          if ((((uVar7 != this->killer[1].bits && uVar7 != this->killer[0].bits) &&
               ((uVar7 & 0xf) != 3 && (uVar7 & 0xff00000) == 0)) && pNVar11->checks == 0) &&
             ((char)_hist[uVar7 & 0xfff] < depth)) {
            _stats._208_8_ = _stats._208_8_ + 1;
            local_44 = ~(uint)((byte)_hist[uVar7 & 0xfff] >> 7) + iVar9;
            goto LAB_00133341;
          }
LAB_00133345:
          iVar6 = Search<(clunk::NodeType)1,true>(pNVar11,~uVar5,beta_00,local_44,true);
        }
        else {
LAB_00133341:
          if (0 < local_44) goto LAB_00133345;
          iVar6 = QSearch<true>(pNVar11,~uVar5,beta_00,0);
        }
        uVar7 = -iVar6;
        pNVar11 = this->child;
        if ((SBORROW4(uVar5,uVar7) != (int)(uVar5 + iVar6) < 0) && (_stop == 0)) {
          if (pNVar11->depthChange < 0) {
            __assert_fail("child->depthChange >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x1074,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                         );
          }
          _stats._232_8_ = _stats._232_8_ + 1;
          if (local_44 < iVar9) {
            if (uVar5 + 1 != uVar12) {
              __assert_fail("(alpha + 1) == beta",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x107e,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                           );
            }
            _stats._216_8_ = _stats._216_8_ + 1;
            iVar6 = Search<(clunk::NodeType)1,true>(pNVar11,iVar4,beta_00,iVar9,false);
            uVar7 = -iVar6;
            pNVar11 = this->child;
          }
          _stats._224_8_ = _stats._224_8_ + (ulong)((int)uVar5 < (int)uVar7);
        }
        if (pNVar11->depthChange <= ~depth) {
          __assert_fail("(depth + child->depthChange) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x1086,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                       );
        }
        Undo<false>(this,pMVar8);
        if (_stop != 0) {
          return uVar12;
        }
        if ((int)local_68 < (int)uVar7) {
          uVar2 = this->child->depthChange;
          local_70 = ((int)uVar2 >> 0x1f & uVar2) + depth;
          UpdatePV(this,pMVar8);
          local_68 = uVar7;
          if ((int)uVar12 <= (int)uVar7) {
            if ((int)uVar2 < 0) {
              __assert_fail("pvDepth == depth",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x1090,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                           );
            }
            AddKiller(this,pMVar8,local_70);
            uVar5 = -uVar7;
            if (0 < (int)uVar7) {
              uVar5 = uVar7;
            }
            alpha = uVar12;
            if (31000 < uVar5) {
              alpha = uVar7;
            }
            entryKey = this->positionKey;
            iVar9 = this->ply;
            iVar4 = this->depthChange;
            iVar13 = 5;
LAB_00133598:
            HashEntry::Set(this_00,entryKey,pMVar8,alpha,iVar9,local_70,iVar13,
                           (uint)(0 < iVar4) << 3);
            return local_68;
          }
        }
        if ((int)uVar7 <= (int)uVar5) {
          uVar7 = pMVar8->bits;
          if (((uVar7 & 0xf) != 3 && (uVar7 & 0xff00000) == 0) && this->checks == 0) {
            cVar10 = _hist[uVar7 & 0xfff];
            if ((char)_hist[uVar7 & 0xfff] < '\0') {
              cVar10 = -1;
            }
            _hist[uVar7 & 0xfff] = cVar10 + -1;
          }
          goto LAB_0013327b;
        }
        uVar5 = uVar7;
        if (local_70 != depth) {
          __assert_fail("pvDepth == depth",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x109b,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                       );
        }
      } while( true );
    }
    if ((int)uVar7 < 0) {
      __assert_fail("pvDepth == depth",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x103a,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::NonPV, color = false]"
                   );
    }
    AddKiller(this,&firstMove,local_70);
    uVar7 = -uVar5;
    if (0 < (int)uVar5) {
      uVar7 = uVar5;
    }
    if (31000 < uVar7) {
      uVar12 = local_68;
    }
    HashEntry::Set(this_00,this->positionKey,&firstMove,uVar12,this->ply,local_70,5,
                   (uint)(0 < this->depthChange) << 3);
  }
  return local_68;
}

Assistant:

int Search(int alpha, int beta, int depth, const bool cutNode) {
    assert(parent);
    assert(ply > 0);
    assert(alpha < beta);
    assert(abs(alpha) <= Infinity);
    assert(abs(beta) <= Infinity);
    assert(depth > 0);
    assert((type == PV) | ((alpha + 1) == beta));
    assert(cutNode ? lastMove.IsValid() : true);

    _stats.snodes++;
    moveIndex   = 0;
    moveCount   = 0;
    pvCount     = 0;
    depthChange = 0;

    if (IsDraw()) {
      return (standPat = _drawScore[color]);
    }

    // mate distance pruning
    int best = (ply - Infinity);
    alpha = std::max<int>(best, alpha);
    beta = std::min<int>((Infinity - ply + 1), beta);
    if ((alpha >= beta) | !child) {
      return alpha;
    }

    // check extensions
    if (checks && (parent->depthChange <= 0)) {
      _stats.chkExts++;
      depthChange++;
      depth++;
    }

    const bool pvNode = (type == PV);
    int eval = Infinity;
    Move firstMove;

    // transposition table lookup
    HashEntry* entry = _tt.Get(positionKey);
    if (entry->Key() == positionKey) {
      _tt.IncHits();
      switch (entry->GetPrimaryFlag()) {
      case HashEntry::Checkmate: return (ply - Infinity);
      case HashEntry::Stalemate: return (standPat = _drawScore[color]);
      case HashEntry::UpperBound:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        if (((!pvNode) | entry->HasPvFlag()) &&
            ((entry->Depth() >= depth) & (firstMove.GetScore() <= alpha)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          return firstMove.GetScore();
        }
        eval = firstMove.GetScore();
        break;
      case HashEntry::ExactScore:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        assert(entry->HasPvFlag());
        if ((entry->Depth() >= depth) &
            ((!pvNode) |
             (firstMove.GetScore() <= alpha) |
             (firstMove.GetScore() >= beta)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          if (firstMove.GetScore() >= beta) {
            AddKiller(firstMove, depth);
          }
          else if ((!checks) & (firstMove.GetScore() > alpha) &
                   (!firstMove.IsCapOrPromo()))
          {
            IncHistory(firstMove, depth);
          }
          return firstMove.GetScore();
        }
        eval = firstMove.GetScore();
        break;
      case HashEntry::LowerBound:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        if (((!pvNode) | entry->HasPvFlag()) &&
            ((entry->Depth() >= depth) & (firstMove.GetScore() >= beta)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          AddKiller(firstMove, depth);
          return firstMove.GetScore();
        }
        break;
      default:
        assert(false);
      }
      if (((depthChange <= 0) & (parent->depthChange <= 0)) &&
          entry->HasExtendedFlag())
      {
        _stats.hashExts++;
        depthChange++;
        depth++;
      }
    }

    assert(depthChange >= 0);
    assert(!moveIndex);
    assert(!moveCount);
    assert(!pvCount);

    // forward pruning (the risky stuff)
    if ((cutNode & (!pvNode) & (!depthChange) & (!checks)) &&
        !IsKiller(lastMove) &&
        ((_pcount[color] + _pcount[color|Knight]) > 1) &&
        ((_pcount[color] + _pcount[color|Knight] + _pcount[color|Pawn] > 2)))
    {
      assert((alpha + 1) == beta);
      Evaluate();
      eval = std::min<int>(eval, standPat);

      // static null move pruning
      if (depth == 1) {
        if ((eval >= (beta + (3 * PawnValue))) & (abs(beta) < WinningScore)) {
          _stats.staticNM++;
          depthChange = -1;
          return beta;
        }
      }

      // null move pruning
      else if (eval >= beta) {
        ExecNullMove<color>(*child);
        const int rdepth = (depth - 3 - (depth / 6) - ((eval - 500) >= beta));
        eval = (rdepth > 0)
            ? -child->Search<NonPV, !color>(-beta, -alpha, rdepth, false)
            : -child->QSearch<!color>(-beta, -alpha, 0);
        if (_stop) {
          return beta;
        }
        if (eval >= beta) {
          _stats.nmCutoffs++;
          depthChange = -depth;
          return std::max<int>(standPat, beta); // do not return eval
        }
      }
    }

    assert(!moveIndex);
    assert(!moveCount);

    // internal iterative deepening
    if ((!firstMove) & (depth > 3)) {
      assert(!moveCount);
      assert(!pvCount);
      _stats.iidCount++;
      eval = Search<NonPV, color>((beta - 1), beta, (depth - 2), false);
      if (_stop | !pvCount) {
        return eval;
      }
      assert(moveCount > 0);
      assert(pvCount > 0);
      assert(pv[0].IsValid());
      firstMove = pv[0];
      moveIndex = 1;
    }

    // make sure firstMove is populated
    else if (!firstMove) {
      assert(!moveCount);
      assert(!pvCount);
      GenerateMoves<color, false>(depth);
      if (moveCount <= 0) {
        if (checks) {
          entry->SetCheckmate(positionKey);
          _tt.IncCheckmates();
          return (ply - Infinity);
        }
        entry->SetStalemate(positionKey);
        _tt.IncStalemates();
        return (standPat = _drawScore[color]);
      }

      firstMove = *GetNextMove();
      assert(moveIndex == 1);
    }

    // single reply extensions
    if ((moveCount == 1) & (depthChange <= 0) & (parent->depthChange <= 0)) {
      _stats.oneReplyExts++;
      depthChange++;
      depth++;
    }

    // search first move with full alpha/beta window
    const int orig_alpha = alpha;
    Exec<color>(firstMove, *child);
    best = (depth > 1)
        ? -child->Search<type, !color>(-beta, -alpha, (depth - 1), !cutNode)
        : -child->QSearch<!color>(-beta, -alpha, 0);
    Undo<color>(firstMove);
    if (_stop) {
      return beta;
    }
    int pvDepth = (depth + std::min<int>(0, child->depthChange));
    UpdatePV(firstMove);
    if (best >= beta) {
      assert(pvDepth == depth);
      AddKiller(firstMove, pvDepth);
      eval = ((abs(best) > MateScore) ? best : beta);
      entry->Set(positionKey, firstMove, eval, ply, pvDepth,
                 HashEntry::LowerBound,
                 (((depthChange > 0) ? HashEntry::Extended : 0) |
                  (pvNode ? HashEntry::FromPV : 0)));
      return best;
    }
    if (best > alpha) {
      assert(pvDepth == depth);
      alpha = best;
    }
    else if (!(checks | firstMove.IsCapOrPromo())) {
      DecHistory(firstMove);
    }

    // generate moves if we haven't done so already
    if (moveCount <= 0) {
      GenerateMoves<color, false>(depth);
      assert(moveCount > 0);
      assert((moveCount == 1) ? (moves[0] == firstMove) : true);
    }

    assert(moveIndex <= 1);
    assert(moveIndex <= moveCount);

    // search remaining moves
    const bool lmrOK = ((!pvNode) & (depth > 2) & (!checks));
    Move* move;
    while ((move = GetNextMove())) {
      assert(move->IsValid());
      if (firstMove == (*move)) {
        continue;
      }

      _stats.lateMoves++;
      Exec<color>(*move, *child);

      // late move reductions
      int d = (depth - 1);
      if (lmrOK) {
        _stats.lmCandidates++;
        if (!(move->IsCapOrPromo() | IsKiller(*move) | child->checks) &&
            (_hist[move->TypeToIndex()] < depth))
        {
          _stats.lmReductions++;
          d -= (1 + (_hist[move->TypeToIndex()] < 0));
        }
      }

      // first search with a null window to quickly see if it improves alpha
      eval = (d > 0)
          ? -child->Search<NonPV, !color>(-(alpha + 1), -alpha, d, true)
          : -child->QSearch<!color>(-(alpha + 1), -alpha, 0);

      // re-search it?
      if ((!_stop) & (eval > alpha)) {
        assert(child->depthChange >= 0);
        _stats.lmAlphaIncs++;
        if (pvNode) {
          assert(d == (depth - 1));
          _stats.lmResearches++;
          eval = (d > 0)
              ? -child->Search<PV, !color>(-beta, -alpha, d, false)
              : -child->QSearch<!color>(-beta, -alpha, 0);
        }
        else if (d < (depth - 1)) {
          assert((alpha + 1) == beta);
          _stats.lmResearches++;
          d = (depth - 1);
          eval = -child->Search<NonPV, !color>(-beta, -alpha, d, false);
        }
        _stats.lmConfirmed += (eval > alpha);
      }

      assert((depth + child->depthChange) >= 0);
      Undo<color>(*move);
      if (_stop) {
        return beta;
      }
      if (eval > best) {
        best = eval;
        pvDepth = (depth + std::min<int>(0, child->depthChange));
        UpdatePV(*move);
        if (eval >= beta) {
          assert(pvDepth == depth);
          AddKiller(*move, pvDepth);
          eval = ((abs(best) > MateScore) ? best : beta);
          entry->Set(positionKey, *move, eval, ply, pvDepth,
                     HashEntry::LowerBound,
                     (((depthChange > 0) ? HashEntry::Extended : 0) |
                      (pvNode ? HashEntry::FromPV : 0)));
          return best;
        }
      }
      if (eval > alpha) {
        assert(pvDepth == depth);
        alpha = eval;
      }
      else if (!(checks | move->IsCapOrPromo())) {
        DecHistory(*move);
      }
    }

    assert(moveCount > 0);
    assert(best <= alpha);
    assert(alpha < beta);

    if (pvCount > 0) {
      assert(pvDepth >= 0);
      assert(pv[0].IsValid());
      if (!(checks | pv[0].IsCapOrPromo())) {
        IncHistory(pv[0], depth);
      }
      if (best > orig_alpha) {
        assert(pvNode);
        assert(pvDepth == depth);
        entry->Set(positionKey, pv[0], best, ply, pvDepth,
            HashEntry::ExactScore,
            (((depthChange > 0) ? HashEntry::Extended : 0) |
             HashEntry::FromPV));
      }
      else {
        assert(alpha == orig_alpha);
        entry->Set(positionKey, pv[0], alpha, ply, pvDepth,
            HashEntry::UpperBound,
            (((depthChange > 0) ? HashEntry::Extended : 0) |
             (pvNode ? HashEntry::FromPV : 0)));
      }
    }

    return best;
  }